

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O1

Message * __thiscall helics::MessageHolder::newMessage(MessageHolder *this)

{
  pointer piVar1;
  tuple<helics::Message_*,_std::default_delete<helics::Message>_> __ptr;
  pointer puVar2;
  __uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true> __s;
  Message *pMVar3;
  pointer puVar4;
  pointer __p;
  int iVar5;
  _Head_base<0UL,_helics::Message_*,_false> local_30;
  
  piVar1 = (this->freeMessageSlots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((this->freeMessageSlots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start == piVar1) {
    pMVar3 = (Message *)operator_new(0x100);
    memset(pMVar3,0,0x100);
    (pMVar3->data).bufferCapacity = 0x40;
    (pMVar3->data).heap = (byte *)&pMVar3->data;
    (pMVar3->data).nonOwning = false;
    (pMVar3->data).locked = false;
    (pMVar3->data).usingAllocatedBuffer = false;
    (pMVar3->data).errorCondition = '\0';
    (pMVar3->data).userKey = 0;
    (pMVar3->dest)._M_dataplus._M_p = (pointer)&(pMVar3->dest).field_2;
    (pMVar3->dest)._M_string_length = 0;
    (pMVar3->dest).field_2._M_local_buf[0] = '\0';
    (pMVar3->source)._M_dataplus._M_p = (pointer)&(pMVar3->source).field_2;
    (pMVar3->source)._M_string_length = 0;
    (pMVar3->source).field_2._M_local_buf[0] = '\0';
    (pMVar3->original_source)._M_dataplus._M_p = (pointer)&(pMVar3->original_source).field_2;
    (pMVar3->original_source)._M_string_length = 0;
    (pMVar3->original_source).field_2._M_local_buf[0] = '\0';
    (pMVar3->original_dest)._M_dataplus._M_p = (pointer)&(pMVar3->original_dest).field_2;
    (pMVar3->original_dest)._M_string_length = 0;
    (pMVar3->original_dest).field_2._M_local_buf[0] = '\0';
    pMVar3->counter = 0;
    pMVar3->backReference = (void *)0x0;
    local_30._M_head_impl = pMVar3;
    std::
    vector<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::allocator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>>
    ::emplace_back<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>
              ((vector<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::allocator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>>
                *)this,(unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                       &local_30);
    if (local_30._M_head_impl != (Message *)0x0) {
      std::default_delete<helics::Message>::operator()
                ((default_delete<helics::Message> *)&local_30,local_30._M_head_impl);
    }
    puVar2 = (this->messages).
             super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar4 = puVar2 + -1;
    iVar5 = (int)((ulong)((long)puVar2 -
                         (long)(this->messages).
                               super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
  }
  else {
    iVar5 = piVar1[-1];
    (this->freeMessageSlots).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar1 + -1;
    __s.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
    super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
    super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl =
         (__uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>)
         operator_new(0x100);
    memset((void *)__s.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
                   super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl,0,0x100);
    *(undefined8 *)
     ((long)__s.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
            super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
            super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x58) = 0x40;
    *(long *)((long)__s.
                    super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                    .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x60) =
         (long)__s.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
               _M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
               .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x10;
    *(undefined8 *)
     ((long)__s.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
            super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
            super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x68) = 0;
    *(long *)((long)__s.
                    super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                    .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x70) =
         (long)__s.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
               _M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
               .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x80;
    *(undefined8 *)
     ((long)__s.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
            super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
            super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x78) = 0;
    *(undefined1 *)
     ((long)__s.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
            super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
            super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x80) = 0;
    *(long *)((long)__s.
                    super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                    .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x90) =
         (long)__s.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
               _M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
               .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0xa0;
    *(undefined8 *)
     ((long)__s.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
            super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
            super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x98) = 0;
    *(undefined1 *)
     ((long)__s.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
            super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
            super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0xa0) = 0;
    *(long *)((long)__s.
                    super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                    .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0xb0) =
         (long)__s.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
               _M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
               .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0xc0;
    *(undefined8 *)
     ((long)__s.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
            super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
            super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0xb8) = 0;
    *(undefined1 *)
     ((long)__s.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
            super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
            super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0xc0) = 0;
    *(long *)((long)__s.
                    super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                    .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0xd0) =
         (long)__s.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
               _M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
               .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0xe0;
    *(undefined8 *)
     ((long)__s.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
            super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
            super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0xd8) = 0;
    *(undefined1 *)
     ((long)__s.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
            super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
            super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0xe0) = 0;
    *(undefined4 *)
     ((long)__s.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
            super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
            super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0xf0) = 0;
    *(undefined8 *)
     ((long)__s.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
            super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
            super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0xf8) = 0;
    puVar4 = (this->messages).
             super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_30._M_head_impl = (Message *)0x0;
    __ptr.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
    super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl =
         *(_Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_> *)
          &puVar4[iVar5]._M_t.
           super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>;
    puVar4[iVar5]._M_t.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
         = __s.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
           super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
           super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
    if (__ptr.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
        super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl !=
        (_Head_base<0UL,_helics::Message_*,_false>)0x0) {
      std::default_delete<helics::Message>::operator()
                ((default_delete<helics::Message> *)(puVar4 + iVar5),
                 (Message *)
                 __ptr.
                 super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
                 super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl);
    }
    if (local_30._M_head_impl != (Message *)0x0) {
      std::default_delete<helics::Message>::operator()
                ((default_delete<helics::Message> *)&local_30,local_30._M_head_impl);
    }
    puVar4 = (this->messages).
             super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + iVar5;
  }
  pMVar3 = (puVar4->_M_t).
           super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
           super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
           super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
  pMVar3->counter = iVar5;
  pMVar3->messageValidation = 0xb3;
  pMVar3->backReference = this;
  return pMVar3;
}

Assistant:

Message* MessageHolder::newMessage()
{
    Message* message{nullptr};
    if (!freeMessageSlots.empty()) {
        auto index = freeMessageSlots.back();
        freeMessageSlots.pop_back();
        messages[index] = std::make_unique<Message>();
        message = messages[index].get();
        message->counter = index;

    } else {
        messages.push_back(std::make_unique<Message>());
        message = messages.back().get();
        message->counter = static_cast<int32_t>(messages.size()) - 1;
    }

    message->messageValidation = messageKeyCode;
    message->backReference = static_cast<void*>(this);
    return message;
}